

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaStr.c
# Opt level: O2

void Str_MuxInputsCollect_rec(Gia_Man_t *p,Gia_Obj_t *pObj,Vec_Int_t *vNodes)

{
  int iVar1;
  
  for (; (pObj->field_0x3 & 0x40) != 0;
      pObj = pObj + -((ulong)*(uint *)&pObj->field_0x4 & 0x1fffffff)) {
    iVar1 = Gia_ObjFaninId2p(p,pObj);
    Vec_IntPush(vNodes,iVar1);
    Str_MuxInputsCollect_rec(p,pObj + -(*(ulong *)pObj & 0x1fffffff),vNodes);
  }
  iVar1 = Gia_ObjId(p,pObj);
  Vec_IntPush(vNodes,iVar1);
  return;
}

Assistant:

void Str_MuxInputsCollect_rec( Gia_Man_t * p, Gia_Obj_t * pObj, Vec_Int_t * vNodes )
{
    if ( !pObj->fMark0 )
    {
        Vec_IntPush( vNodes, Gia_ObjId(p, pObj) );
        return;
    }
    Vec_IntPush( vNodes, Gia_ObjFaninId2p(p, pObj) );
    Str_MuxInputsCollect_rec( p, Gia_ObjFanin0(pObj), vNodes );
    Str_MuxInputsCollect_rec( p, Gia_ObjFanin1(pObj), vNodes );
}